

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O0

bool __thiscall
lzham::lzcompressor::state::encode
          (state *this,symbol_codec *codec,CLZBase *lzbase,search_accelerator *dict,
          lzdecision *lzdec)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  CLZBase *in_RDX;
  uint in_ESI;
  state *in_RDI;
  lzdecision *in_R8;
  uint num_extra_bits;
  uint main_sym;
  uint match_high_sym;
  int large_len_sym;
  uint match_low_sym;
  uint match_extra;
  uint match_slot;
  int dist_1;
  int dist;
  int match_hist_index;
  uint delta_lit;
  uint rep_lit0;
  uint lit;
  uint is_match_model_index;
  uint in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar6;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  lzdecision *local_30;
  CLZBase *local_20;
  uint local_18;
  
  local_34 = (in_RDI->super_state_base).m_cur_state;
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_ESI;
  bVar3 = lzdecision::is_match(in_R8);
  cVar1 = (char)in_RDI;
  uVar5 = lzham::symbol_codec::encode
                    (in_ESI,(adaptive_bit_model *)(ulong)bVar3,
                     (bool)(cVar1 + '$' + (char)local_34 * '\x02'));
  if ((uVar5 & 1) == 0) {
    return false;
  }
  bVar3 = lzdecision::is_match(local_30);
  if (bVar3) {
    if (local_30->m_dist < 0) {
      uVar5 = lzham::symbol_codec::encode
                        (local_18,(adaptive_bit_model *)0x1,
                         (bool)(cVar1 + '<' + (char)(in_RDI->super_state_base).m_cur_state * '\x02')
                        );
      if ((uVar5 & 1) == 0) {
        return false;
      }
      local_44 = -1 - local_30->m_dist;
      if (local_44 == 0) {
        uVar5 = lzham::symbol_codec::encode
                          (local_18,(adaptive_bit_model *)0x1,
                           (bool)(cVar1 + 'T' +
                                 (char)(in_RDI->super_state_base).m_cur_state * '\x02'));
        if ((uVar5 & 1) == 0) {
          return false;
        }
        if (local_30->m_len == 1) {
          uVar5 = lzham::symbol_codec::encode
                            (local_18,(adaptive_bit_model *)0x1,
                             (bool)(cVar1 + 'l' +
                                   (char)(in_RDI->super_state_base).m_cur_state * '\x02'));
          if ((uVar5 & 1) == 0) {
            return false;
          }
          uVar4 = 0xb;
          if ((in_RDI->super_state_base).m_cur_state < 7) {
            uVar4 = 9;
          }
          (in_RDI->super_state_base).m_cur_state = uVar4;
        }
        else {
          uVar5 = lzham::symbol_codec::encode
                            (local_18,(adaptive_bit_model *)0x0,
                             (bool)(cVar1 + 'l' +
                                   (char)(in_RDI->super_state_base).m_cur_state * '\x02'));
          if ((uVar5 & 1) == 0) {
            return false;
          }
          if (local_30->m_len < 0x102) {
            uVar5 = lzham::symbol_codec::encode
                              (local_18,(quasi_adaptive_huffman_data_model *)
                                        (ulong)(local_30->m_len - 2));
            if ((uVar5 & 1) == 0) {
              return false;
            }
          }
          else {
            uVar5 = lzham::symbol_codec::encode(local_18,(quasi_adaptive_huffman_data_model *)0x100)
            ;
            if ((uVar5 & 1) == 0) {
              return false;
            }
            uVar4 = get_huge_match_code_bits(local_30->m_len);
            get_huge_match_code_len(local_30->m_len);
            uVar5 = lzham::symbol_codec::encode_bits(local_18,uVar4);
            if ((uVar5 & 1) == 0) {
              return false;
            }
          }
          uVar4 = 0xb;
          if ((in_RDI->super_state_base).m_cur_state < 7) {
            uVar4 = 8;
          }
          (in_RDI->super_state_base).m_cur_state = uVar4;
        }
      }
      else {
        uVar5 = lzham::symbol_codec::encode
                          (local_18,(adaptive_bit_model *)0x0,
                           (bool)(cVar1 + 'T' +
                                 (char)(in_RDI->super_state_base).m_cur_state * '\x02'));
        if ((uVar5 & 1) == 0) {
          return false;
        }
        if (local_30->m_len < 0x102) {
          uVar5 = lzham::symbol_codec::encode
                            (local_18,(quasi_adaptive_huffman_data_model *)
                                      (ulong)(local_30->m_len - 2));
          if ((uVar5 & 1) == 0) {
            return false;
          }
        }
        else {
          uVar5 = lzham::symbol_codec::encode(local_18,(quasi_adaptive_huffman_data_model *)0x100);
          uVar2 = local_18;
          if ((uVar5 & 1) == 0) {
            return false;
          }
          uVar4 = get_huge_match_code_bits(local_30->m_len);
          get_huge_match_code_len(local_30->m_len);
          uVar5 = lzham::symbol_codec::encode_bits(uVar2,uVar4);
          if ((uVar5 & 1) == 0) {
            return false;
          }
        }
        if (local_44 == 1) {
          uVar5 = lzham::symbol_codec::encode
                            (local_18,(adaptive_bit_model *)0x1,
                             (bool)(cVar1 + -0x7c +
                                   (char)(in_RDI->super_state_base).m_cur_state * '\x02'));
          if ((uVar5 & 1) == 0) {
            return false;
          }
          std::swap<unsigned_int>
                    ((in_RDI->super_state_base).m_match_hist,
                     (in_RDI->super_state_base).m_match_hist + 1);
        }
        else {
          uVar5 = lzham::symbol_codec::encode
                            (local_18,(adaptive_bit_model *)0x0,
                             (bool)(cVar1 + -0x7c +
                                   (char)(in_RDI->super_state_base).m_cur_state * '\x02'));
          if ((uVar5 & 1) == 0) {
            return false;
          }
          if (local_44 == 2) {
            uVar5 = lzham::symbol_codec::encode
                              (local_18,(adaptive_bit_model *)0x1,
                               (bool)(cVar1 + -100 +
                                     (char)(in_RDI->super_state_base).m_cur_state * '\x02'));
            if ((uVar5 & 1) == 0) {
              return false;
            }
            local_48 = (in_RDI->super_state_base).m_match_hist[2];
            (in_RDI->super_state_base).m_match_hist[2] = (in_RDI->super_state_base).m_match_hist[1];
            (in_RDI->super_state_base).m_match_hist[1] = (in_RDI->super_state_base).m_match_hist[0];
            (in_RDI->super_state_base).m_match_hist[0] = local_48;
          }
          else {
            uVar5 = lzham::symbol_codec::encode
                              (local_18,(adaptive_bit_model *)0x0,
                               (bool)(cVar1 + -100 +
                                     (char)(in_RDI->super_state_base).m_cur_state * '\x02'));
            if ((uVar5 & 1) == 0) {
              return false;
            }
            local_4c = (in_RDI->super_state_base).m_match_hist[3];
            (in_RDI->super_state_base).m_match_hist[3] = (in_RDI->super_state_base).m_match_hist[2];
            (in_RDI->super_state_base).m_match_hist[2] = (in_RDI->super_state_base).m_match_hist[1];
            (in_RDI->super_state_base).m_match_hist[1] = (in_RDI->super_state_base).m_match_hist[0];
            (in_RDI->super_state_base).m_match_hist[0] = local_4c;
          }
        }
        uVar4 = 0xb;
        if ((in_RDI->super_state_base).m_cur_state < 7) {
          uVar4 = 8;
        }
        (in_RDI->super_state_base).m_cur_state = uVar4;
      }
    }
    else {
      uVar5 = lzham::symbol_codec::encode
                        (local_18,(adaptive_bit_model *)0x0,
                         (bool)(cVar1 + '<' + (char)(in_RDI->super_state_base).m_cur_state * '\x02')
                        );
      if ((uVar5 & 1) == 0) {
        return false;
      }
      CLZBase::compute_lzx_position_slot(local_20,local_30->m_dist,&local_50,&local_54);
      local_5c = 0xffffffff;
      if (local_30->m_len < 9) {
        local_58 = local_30->m_len - 2;
      }
      else {
        local_58 = 7;
        local_5c = local_30->m_len - 9;
      }
      uVar5 = lzham::symbol_codec::encode
                        (local_18,(quasi_adaptive_huffman_data_model *)
                                  (ulong)((local_58 | (local_50 - 1) * 8) + 2));
      if ((uVar5 & 1) == 0) {
        return false;
      }
      if (-1 < (int)local_5c) {
        if (local_30->m_len < 0x102) {
          uVar5 = lzham::symbol_codec::encode
                            (local_18,(quasi_adaptive_huffman_data_model *)(ulong)local_5c);
          if ((uVar5 & 1) == 0) {
            return false;
          }
        }
        else {
          uVar5 = lzham::symbol_codec::encode(local_18,(quasi_adaptive_huffman_data_model *)0xf9);
          uVar2 = local_18;
          if ((uVar5 & 1) == 0) {
            return false;
          }
          uVar4 = get_huge_match_code_bits(local_30->m_len);
          get_huge_match_code_len(local_30->m_len);
          uVar5 = lzham::symbol_codec::encode_bits(uVar2,uVar4);
          if ((uVar5 & 1) == 0) {
            return false;
          }
        }
      }
      if (*(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + (ulong)local_50) < 3) {
        uVar5 = lzham::symbol_codec::encode_bits(local_18,local_54);
        if ((uVar5 & 1) == 0) {
          return false;
        }
      }
      else {
        if ((4 < *(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + (ulong)local_50)) &&
           (uVar5 = lzham::symbol_codec::encode_bits(local_18,local_54 >> 4), (uVar5 & 1) == 0)) {
          return false;
        }
        uVar5 = lzham::symbol_codec::encode
                          (local_18,(quasi_adaptive_huffman_data_model *)(ulong)(local_54 & 0xf));
        if ((uVar5 & 1) == 0) {
          return false;
        }
      }
      update_match_hist(in_RDI,local_30->m_dist);
      uVar4 = 10;
      if ((in_RDI->super_state_base).m_cur_state < 7) {
        uVar4 = 7;
      }
      (in_RDI->super_state_base).m_cur_state = uVar4;
    }
  }
  else {
    local_38 = search_accelerator::operator[]
                         ((search_accelerator *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff4c);
    if ((in_RDI->super_state_base).m_cur_state < 7) {
      uVar5 = lzham::symbol_codec::encode
                        (local_18,(quasi_adaptive_huffman_data_model *)(ulong)local_38);
      if ((uVar5 & 1) == 0) {
        return false;
      }
    }
    else {
      local_3c = search_accelerator::operator[]
                           ((search_accelerator *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff4c);
      local_40 = local_3c ^ local_38;
      uVar5 = lzham::symbol_codec::encode
                        (local_18,(quasi_adaptive_huffman_data_model *)(ulong)local_40);
      if ((uVar5 & 1) == 0) {
        return false;
      }
    }
    if ((in_RDI->super_state_base).m_cur_state < 4) {
      (in_RDI->super_state_base).m_cur_state = 0;
    }
    else if ((in_RDI->super_state_base).m_cur_state < 10) {
      (in_RDI->super_state_base).m_cur_state = (in_RDI->super_state_base).m_cur_state - 3;
    }
    else {
      (in_RDI->super_state_base).m_cur_state = (in_RDI->super_state_base).m_cur_state - 6;
    }
  }
  iVar6 = local_30->m_pos;
  uVar4 = lzdecision::get_len((lzdecision *)0x11959f);
  (in_RDI->super_state_base).m_cur_ofs = iVar6 + uVar4;
  return true;
}

Assistant:

bool lzcompressor::state::encode(symbol_codec& codec, CLZBase& lzbase, const search_accelerator& dict, const lzdecision& lzdec)
   {
      //const uint lit_pred0 = get_pred_char(dict, lzdec.m_pos, 1);

      uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(m_cur_state);
      if (!codec.encode(lzdec.is_match(), m_is_match_model[is_match_model_index])) 
      {
         LZHAM_LOG_ERROR(8018);
         return false;
      }

      if (!lzdec.is_match())
      {
         const uint lit = dict[lzdec.m_pos];

#ifdef LZHAM_LZDEBUG
         if (!codec.encode_bits(lit, 8)) 
         {
            LZHAM_LOG_ERROR(8019);  
            return false;
         }
#endif

         if (m_cur_state < CLZBase::cNumLitStates)
         {
            // literal
            if (!codec.encode(lit, m_lit_table)) 
            {
               LZHAM_LOG_ERROR(8020);
               return false;
            }
         }
         else
         {
            // delta literal
            const uint rep_lit0 = dict[(lzdec.m_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
            
            uint delta_lit = rep_lit0 ^ lit;

#ifdef LZHAM_LZDEBUG
            if (!codec.encode_bits(rep_lit0, 8)) 
            {
               LZHAM_LOG_ERROR(8021);
               return false;
            }
#endif

            if (!codec.encode(delta_lit, m_delta_lit_table)) 
            {
               LZHAM_LOG_ERROR(8022);
               return false;
            }
         }

         if (m_cur_state < 4) m_cur_state = 0; else if (m_cur_state < 10) m_cur_state -= 3; else m_cur_state -= 6;
      }
      else
      {
         // match
         if (lzdec.m_dist < 0)
         {
            // rep match
            if (!codec.encode(1, m_is_rep_model[m_cur_state])) 
            {
               LZHAM_LOG_ERROR(8023);
               return false;
            }

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               // rep0 match
               if (!codec.encode(1, m_is_rep0_model[m_cur_state])) 
               {
                  LZHAM_LOG_ERROR(8024);
                  return false;
               }

               if (lzdec.m_len == 1)
               {
                  // single byte rep0
                  if (!codec.encode(1, m_is_rep0_single_byte_model[m_cur_state])) 
                  {
                     LZHAM_LOG_ERROR(8025);
                     return false;
                  }

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 9 : 11;
               }
               else
               {
                  // normal rep0
                  if (!codec.encode(0, m_is_rep0_single_byte_model[m_cur_state])) 
                  {
                     LZHAM_LOG_ERROR(8026);
                     return false;
                  }

                  if (lzdec.m_len > CLZBase::cMaxMatchLen)
                  {
                     if (!codec.encode((CLZBase::cMaxMatchLen + 1) - CLZBase::cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                     {
                        LZHAM_LOG_ERROR(8027);
                        return false;
                     }
                     if (!codec.encode_bits(get_huge_match_code_bits(lzdec.m_len), get_huge_match_code_len(lzdec.m_len))) 
                     {
                        LZHAM_LOG_ERROR(8028);
                        return false;
                     }
                  }
                  else
                  {
                     if (!codec.encode(lzdec.m_len - CLZBase::cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                     {
                        LZHAM_LOG_ERROR(8029);
                        return false;
                     }
                  }

                  m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
               }
            }
            else
            {
               // rep1-rep3 match
               if (!codec.encode(0, m_is_rep0_model[m_cur_state])) 
               {
                  LZHAM_LOG_ERROR(8030);
                  return false;
               }

               if (lzdec.m_len > CLZBase::cMaxMatchLen)
               {
                  if (!codec.encode((CLZBase::cMaxMatchLen + 1) - CLZBase::cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                  {
                     LZHAM_LOG_ERROR(8031);
                     return false;
                  }
                  if (!codec.encode_bits(get_huge_match_code_bits(lzdec.m_len), get_huge_match_code_len(lzdec.m_len))) 
                  {
                     LZHAM_LOG_ERROR(8032);
                     return false;
                  }
               }
               else
               {
                  if (!codec.encode(lzdec.m_len - CLZBase::cMinMatchLen, m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                  {
                     LZHAM_LOG_ERROR(8033);
                     return false;
                  }
               }

               if (match_hist_index == 1)
               {
                  // rep1
                  if (!codec.encode(1, m_is_rep1_model[m_cur_state])) 
                  {
                     LZHAM_LOG_ERROR(8034);
                     return false;
                  }

                  std::swap(m_match_hist[0], m_match_hist[1]);
               }
               else
               {
                  if (!codec.encode(0, m_is_rep1_model[m_cur_state])) 
                  {  
                     LZHAM_LOG_ERROR(8035);
                     return false;
                  }

                  if (match_hist_index == 2)
                  {
                     // rep2
                     if (!codec.encode(1, m_is_rep2_model[m_cur_state])) 
                     {
                        LZHAM_LOG_ERROR(8036);
                        return false;
                     }

                     int dist = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
                  else
                  {
                     // rep3
                     if (!codec.encode(0, m_is_rep2_model[m_cur_state])) 
                     {
                        LZHAM_LOG_ERROR(8037);  
                        return false;
                     }

                     int dist = m_match_hist[3];
                     m_match_hist[3] = m_match_hist[2];
                     m_match_hist[2] = m_match_hist[1];
                     m_match_hist[1] = m_match_hist[0];
                     m_match_hist[0] = dist;
                  }
               }

               m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? 8 : 11;
            }
         }
         else
         {
            if (!codec.encode(0, m_is_rep_model[m_cur_state])) 
            {
               LZHAM_LOG_ERROR(8038);
               return false;
            }

            LZHAM_ASSERT(lzdec.m_len >= CLZBase::cMinMatchLen);

            // full match
            uint match_slot, match_extra;
            lzbase.compute_lzx_position_slot(lzdec.m_dist, match_slot, match_extra);

            uint match_low_sym = 0;
            int large_len_sym = -1;
            if (lzdec.m_len >= 9)
            {
               match_low_sym = 7;

               large_len_sym = lzdec.m_len - 9;
            }
            else
               match_low_sym = lzdec.m_len - 2;

            uint match_high_sym = 0;

            LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
            match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

            uint main_sym = match_low_sym | (match_high_sym << 3);

            if (!codec.encode(CLZBase::cLZXNumSpecialLengths + main_sym, m_main_table)) 
            {  
               LZHAM_LOG_ERROR(8039);
               return false;
            }

            if (large_len_sym >= 0)
            {
               if (lzdec.m_len > CLZBase::cMaxMatchLen)
               {
                  if (!codec.encode((CLZBase::cMaxMatchLen + 1) - 9, m_large_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                  {
                     LZHAM_LOG_ERROR(8040);
                     return false;
                  }
                  if (!codec.encode_bits(get_huge_match_code_bits(lzdec.m_len), get_huge_match_code_len(lzdec.m_len))) 
                  {
                     LZHAM_LOG_ERROR(8041);
                     return false;
                  }
               }
               else
               {
                  if (!codec.encode(large_len_sym, m_large_len_table[m_cur_state >= CLZBase::cNumLitStates])) 
                  {
                     LZHAM_LOG_ERROR(8042);
                     return false;
                  }
               }
            }

            uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
            if (num_extra_bits < 3)
            {
               if (!codec.encode_bits(match_extra, num_extra_bits)) 
               {
                  LZHAM_LOG_ERROR(8043);
                  return false;
               }
            }
            else
            {
               if (num_extra_bits > 4)
               {
                  if (!codec.encode_bits((match_extra >> 4), num_extra_bits - 4)) 
                  {
                     LZHAM_LOG_ERROR(8044);
                     return false;
                  }
               }

               if (!codec.encode(match_extra & 15, m_dist_lsb_table)) 
               {
                  LZHAM_LOG_ERROR(8045);
                  return false;
               }
            }

            update_match_hist(lzdec.m_dist);

            m_cur_state = (m_cur_state < CLZBase::cNumLitStates) ? CLZBase::cNumLitStates : CLZBase::cNumLitStates + 3;
         }

#ifdef LZHAM_LZDEBUG
         if (!codec.encode_bits(m_match_hist[0], 29)) 
         {
            LZHAM_LOG_ERROR(8046);
            return false;
         }
#endif
      }

      m_cur_ofs = lzdec.m_pos + lzdec.get_len();
      return true;
   }